

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# one_valus_inst.c
# Opt level: O0

void i32Popcnt_op(vm *v,instruction *inst)

{
  uint32 uVar1;
  uint32 val;
  stack *s;
  instruction *inst_local;
  vm *v_local;
  
  uVar1 = popU32(&v->operandStack);
  uVar1 = popcount_3((ulong)uVar1);
  pushU32(&v->operandStack,uVar1);
  return;
}

Assistant:

void i32Popcnt_op(vm *v, instruction *inst) {
    stack *s = &v->operandStack;
    uint32 val = popU32(s);
    pushU32(s, (uint32) popcount_3((uint64) val));
    
}